

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mei.c
# Opt level: O2

ssize_t mei_send_msg(mei *me,uchar *buffer,size_t len)

{
  mei_log_callback p_Var1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  char *pcVar5;
  ssize_t sVar6;
  
  if (buffer == (uchar *)0x0 || me == (mei *)0x0) {
    sVar6 = -0x16;
  }
  else {
    if (MEI_LOG_LEVEL_ERROR < me->log_level) {
      if (me->log_callback == (mei_log_callback)0x0) {
        __syslog_chk(7,1,"call write length = %zu\n",len);
      }
      else {
        (*me->log_callback)(false,"call write length = %zu\n",len);
      }
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    sVar4 = write(me->fd,buffer,len);
    iVar2 = *piVar3;
    me->last_err = iVar2;
    sVar6 = (long)-iVar2;
    if (0 < sVar4) {
      sVar6 = sVar4;
    }
    if (sVar6 < 0) {
      iVar2 = __mei_errno_to_state(me);
      me->state = iVar2;
      if (me->log_level != MEI_LOG_LEVEL_QUIET) {
        p_Var1 = me->log_callback;
        pcVar5 = strerror(-(int)sVar6);
        if (p_Var1 == (mei_log_callback)0x0) {
          __syslog_chk(3,1,"me: error: write failed with status [%zd]:%s\n",sVar6,pcVar5);
        }
        else {
          (*p_Var1)(true,"me: error: write failed with status [%zd]:%s\n",sVar6,pcVar5);
        }
      }
    }
  }
  return sVar6;
}

Assistant:

ssize_t mei_send_msg(struct mei *me, const unsigned char *buffer, size_t len)
{
	ssize_t rc;

	if (!me || !buffer)
		return -EINVAL;

	mei_msg(me, "call write length = %zu\n", len);
	mei_dump_hex_buffer(me, buffer, len);

	rc  = __mei_write(me, buffer, len);
	if (rc < 0) {
		me->state = __mei_errno_to_state(me);
		mei_err(me, "write failed with status [%zd]:%s\n",
			rc, strerror(-rc));
		return rc;
	}

	return rc;
}